

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyrsa.cpp
# Opt level: O1

bool RSAVerifySignature(RSA *rsa,uchar *MsgHash,size_t MsgHashLen,char *Msg,size_t MsgLen,
                       bool *Authentic)

{
  int iVar1;
  EVP_PKEY *pkey;
  EVP_MD_CTX *ctx;
  EVP_MD *type;
  
  *Authentic = false;
  pkey = EVP_PKEY_new();
  EVP_PKEY_assign(pkey,6,rsa);
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  type = EVP_sha256();
  iVar1 = EVP_DigestVerifyInit(ctx,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,pkey);
  if ((0 < iVar1) && (iVar1 = EVP_DigestVerifyUpdate(ctx,Msg,MsgLen), 0 < iVar1)) {
    iVar1 = EVP_DigestVerifyFinal(ctx,MsgHash,MsgHashLen);
    if (iVar1 == 0) {
      *Authentic = false;
    }
    else {
      if (iVar1 != 1) {
        *Authentic = false;
        EVP_PKEY_free(pkey);
        EVP_MD_CTX_free(ctx);
        return false;
      }
      *Authentic = true;
    }
    EVP_PKEY_free(pkey);
    EVP_MD_CTX_free(ctx);
    return true;
  }
  EVP_PKEY_free(pkey);
  return false;
}

Assistant:

bool RSAVerifySignature( RSA* rsa,
                         unsigned char* MsgHash,
                         size_t MsgHashLen,
                         const char* Msg,
                         size_t MsgLen,
                         bool* Authentic) {
  *Authentic = false;
  EVP_PKEY* pubKey  = EVP_PKEY_new();
  EVP_PKEY_assign_RSA(pubKey, rsa);
  EVP_MD_CTX* m_RSAVerifyCtx = EVP_MD_CTX_create();

  if (EVP_DigestVerifyInit(m_RSAVerifyCtx,
                           NULL,
                           EVP_sha256(),
                           NULL,
                           pubKey)<=0)
  {
    EVP_PKEY_free(pubKey);
    return false;
  }
  if (EVP_DigestVerifyUpdate(m_RSAVerifyCtx,
                             Msg,
                             MsgLen) <= 0)
  {
    EVP_PKEY_free(pubKey);
    return false;
  }
  int AuthStatus = EVP_DigestVerifyFinal(m_RSAVerifyCtx,
                                         MsgHash,
                                         MsgHashLen);
  if (AuthStatus==1) {
    *Authentic = true;
    EVP_PKEY_free(pubKey);
    EVP_MD_CTX_free(m_RSAVerifyCtx);
    return true;
  } else if(AuthStatus==0){
    *Authentic = false;
    EVP_PKEY_free(pubKey);
    EVP_MD_CTX_free(m_RSAVerifyCtx);
    return true;
  } else{
    *Authentic = false;
    EVP_PKEY_free(pubKey);
    EVP_MD_CTX_free(m_RSAVerifyCtx);
    return false;
  }
}